

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<test_result_(bool)>::Matches
          (OnCallSpec<test_result_(bool)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tr1::tuple<testing::Matcher<bool>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<bool,void,void,void,void,void,void,void,void,void>>
                    (&this->matchers_,args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tr1::tuple<bool,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            ::Matches(&(this->extra_matcher_).
                       super_MatcherBase<const_std::tr1::tuple<bool,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                      ,args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }